

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_compact(REF_NODE ref_node,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_INT *__s;
  REF_INT *pRVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  
  iVar1 = ref_node->max;
  uVar7 = (ulong)iVar1;
  if ((long)uVar7 < 0) {
    pcVar9 = "malloc *o2n_ptr of REF_INT negative";
    uVar6 = 0x366;
  }
  else {
    __s = (REF_INT *)malloc(uVar7 * 4);
    *o2n_ptr = __s;
    if (__s == (REF_INT *)0x0) {
      pcVar9 = "malloc *o2n_ptr of REF_INT NULL";
      uVar6 = 0x366;
LAB_0016d167:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
             "ref_node_compact",pcVar9);
      return 2;
    }
    if (iVar1 != 0) {
      memset(__s,0xff,uVar7 * 4);
    }
    iVar2 = ref_node->n;
    if ((long)iVar2 < 0) {
      pcVar9 = "malloc *n2o_ptr of REF_INT negative";
      uVar6 = 0x368;
    }
    else {
      pRVar4 = (REF_INT *)malloc((long)iVar2 * 4);
      *n2o_ptr = pRVar4;
      if (pRVar4 == (REF_INT *)0x0) {
        pcVar9 = "malloc *n2o_ptr of REF_INT NULL";
        uVar6 = 0x368;
        goto LAB_0016d167;
      }
      if (iVar1 == 0) {
        iVar5 = 0;
      }
      else {
        pRVar3 = ref_node->global;
        uVar8 = 0;
        iVar5 = 0;
        do {
          if ((-1 < pRVar3[uVar8]) && (ref_node->ref_mpi->id == ref_node->part[uVar8])) {
            __s[uVar8] = iVar5;
            iVar5 = iVar5 + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar7);
        if (iVar1 != 0) {
          pRVar3 = ref_node->global;
          uVar8 = 0;
          do {
            if ((-1 < pRVar3[uVar8]) && (ref_node->ref_mpi->id != ref_node->part[uVar8])) {
              __s[uVar8] = iVar5;
              iVar5 = iVar5 + 1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar7);
        }
      }
      if (iVar5 == iVar2) {
        if (iVar1 != 0) {
          pRVar3 = ref_node->global;
          uVar8 = 0;
          do {
            if (-1 < pRVar3[uVar8]) {
              pRVar4[__s[uVar8]] = (REF_INT)uVar8;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        return 0;
      }
      pcVar9 = "nnode miscount";
      uVar6 = 0x37b;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_compact",pcVar9);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_compact(REF_NODE ref_node, REF_INT **o2n_ptr,
                                    REF_INT **n2o_ptr) {
  REF_INT node;
  REF_INT nnode;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_node_n(ref_node), REF_INT);
  n2o = *n2o_ptr;

  nnode = 0;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_node_mpi(ref_node)) == ref_node_part(ref_node, node)) {
      o2n[node] = nnode;
      nnode++;
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_node_mpi(ref_node)) != ref_node_part(ref_node, node)) {
      o2n[node] = nnode;
      nnode++;
    }
  }

  RES(nnode, ref_node_n(ref_node), "nnode miscount");

  each_ref_node_valid_node(ref_node, node) n2o[o2n[node]] = node;

  return REF_SUCCESS;
}